

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

Matrix<double,_4,_2> * __thiscall
gl4cts::Math::outerProduct<2,4>
          (Matrix<double,_4,_2> *__return_storage_ptr__,Math *this,Vector<double,_4> *left,
          Vector<double,_2> *right)

{
  GLuint i;
  long lVar1;
  Matrix<double,_1,_2> right_mat;
  Matrix<double,_4,_1> left_mat;
  Matrix<double,_1,_2> local_88;
  Matrix<double,_4,_1> local_78;
  Matrix<double,_4,_2> local_58;
  
  tcu::Matrix<double,_4,_1>::Matrix(&local_78);
  tcu::Matrix<double,_1,_2>::Matrix(&local_88);
  tcu::Matrix<double,_4,_2>::Matrix(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    local_78.m_data.m_data[0].m_data[lVar1] = *(double *)(this + lVar1 * 8);
  }
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    local_78.m_data.m_data[0].m_data[lVar1 + -2] = left->m_data[lVar1];
  }
  tcu::operator*(&local_58,&local_78,&local_88);
  tcu::Matrix<double,_4,_2>::operator=(__return_storage_ptr__,&local_58);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}